

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::EnumDescriptorProto::ParseFromArray
          (EnumDescriptorProto *this,void *raw,size_t size)

{
  byte bVar1;
  pointer pEVar2;
  pointer pEVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ushort uVar7;
  long lVar8;
  uint *extraout_RDX;
  uint *puVar9;
  uint *puVar10;
  uint *puVar11;
  bool bVar12;
  ulong uVar13;
  uint *puVar14;
  uint *puVar15;
  uint uVar16;
  uint *puVar17;
  vector<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
  *this_00;
  uint *puVar18;
  pointer pEVar19;
  string *psVar20;
  bool bVar21;
  uint *local_80;
  Field local_70;
  vector<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
  *local_60;
  string *local_58;
  uint *local_50;
  uint *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  pEVar2 = (this->value_).
           super__Vector_base<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar3 = (this->value_).
           super__Vector_base<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pEVar19 = pEVar2;
  if (pEVar3 != pEVar2) {
    do {
      (**(pEVar19->super_CppMessageObj)._vptr_CppMessageObj)(pEVar19);
      pEVar19 = pEVar19 + 1;
    } while (pEVar19 != pEVar3);
    (this->value_).
    super__Vector_base<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
    ._M_impl.super__Vector_impl_data._M_finish = pEVar2;
  }
  this_00 = &this->value_;
  local_38 = &this->reserved_name_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_38,(this->reserved_name_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  local_40 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar18 = (uint *)(size + (long)raw);
  puVar9 = extraout_RDX;
  do {
    lVar8 = 7;
    if (puVar18 <= raw) goto LAB_00229fc8;
    uVar13 = (ulong)(char)(byte)*raw;
    puVar11 = (uint *)((long)raw + 1);
    if ((long)uVar13 < 0) {
      bVar1 = (byte)*raw;
      uVar6 = (ulong)(bVar1 & 0x7f);
      bVar12 = false;
      puVar10 = puVar11;
      for (; (uVar13 = uVar6, puVar14 = puVar10, (char)bVar1 < '\0' &&
             (bVar21 = 0x38 < lVar8 - 7U, bVar12 = bVar21 || puVar18 <= puVar10, puVar9 = puVar10,
             uVar13 = 0, puVar14 = puVar11, !bVar21 && puVar18 > puVar10)); lVar8 = lVar8 + 7) {
        bVar1 = (byte)*puVar10;
        puVar10 = (uint *)((long)puVar10 + 1);
        uVar6 = uVar6 | (ulong)(bVar1 & 0x7f) << ((byte)lVar8 & 0x3f);
        puVar9 = puVar10;
      }
      puVar11 = puVar14;
      if (bVar12) {
        puVar11 = (uint *)raw;
        uVar13 = 0;
      }
      if (puVar11 == (uint *)raw) goto LAB_00229fc8;
    }
    uVar5 = (uint)(uVar13 >> 3);
    if ((uVar5 == 0) || (puVar18 <= puVar11)) {
switchD_00229e38_caseD_3:
      bVar12 = false;
      uVar13 = 0;
      local_70.int_value_ = (uint64_t)(uint *)0x0;
    }
    else {
      switch((uint)uVar13 & 7) {
      case 0:
        puVar15 = (uint *)0x0;
        bVar12 = puVar11 >= puVar18;
        if (puVar11 < puVar18) {
          puVar9 = (uint *)((long)puVar11 + 1);
          puVar10 = (uint *)(ulong)((byte)*puVar11 & 0x7f);
          puVar14 = puVar10;
          uVar16 = 0;
          if ((char)(byte)*puVar11 < '\0') {
            puVar14 = (uint *)0x0;
            uVar16 = 0;
            lVar8 = 7;
            puVar17 = puVar9;
            do {
              bVar21 = 0x38 < lVar8 - 7U;
              bVar12 = bVar21 || puVar18 <= puVar17;
              if (bVar21 || puVar18 <= puVar17) goto LAB_00229fce;
              uVar4 = *puVar17;
              puVar17 = (uint *)((long)puVar17 + 1);
              puVar10 = (uint *)((ulong)puVar10 |
                                (ulong)((byte)uVar4 & 0x7f) << ((byte)lVar8 & 0x3f));
              lVar8 = lVar8 + 7;
            } while ((char)(byte)uVar4 < '\0');
            puVar14 = (uint *)((ulong)puVar10 & 0xffffffff);
            puVar9 = puVar17;
            uVar16 = (uint)((ulong)puVar10 >> 0x20);
          }
        }
        else {
          puVar14 = (uint *)0x0;
          uVar16 = 0;
        }
LAB_00229fce:
        puVar10 = (uint *)(ulong)uVar16;
        if (bVar12) {
          puVar9 = puVar11;
          puVar10 = puVar15;
          puVar14 = puVar15;
        }
        local_80 = puVar11;
        local_50 = (uint *)raw;
        if (puVar9 != puVar11) goto LAB_00229ffa;
        uVar13 = 0;
        bVar12 = false;
        local_70.int_value_ = (uint64_t)puVar15;
        goto LAB_0022a03c;
      case 1:
        puVar9 = puVar11 + 2;
        if (puVar18 < puVar9) {
LAB_00229fc8:
          uVar13 = 0;
          bVar12 = false;
          local_70.int_value_ = (uint64_t)(uint *)0x0;
          goto LAB_0022a03c;
        }
        puVar14 = *(uint **)puVar11;
        puVar10 = (uint *)((ulong)puVar14 >> 0x20);
        break;
      case 2:
        bVar12 = puVar11 >= puVar18;
        psVar20 = local_58;
        if (puVar11 < puVar18) {
          puVar10 = (uint *)((long)puVar11 + 1);
          puVar14 = (uint *)(ulong)((byte)*puVar11 & 0x7f);
          puVar9 = puVar10;
          psVar20 = (string *)puVar14;
          if ((char)(byte)*puVar11 < '\0') {
            lVar8 = 7;
            puVar15 = puVar10;
            do {
              bVar12 = 0x38 < lVar8 - 7U || puVar18 <= puVar15;
              puVar9 = puVar10;
              psVar20 = local_58;
              if (bVar12) break;
              uVar16 = *puVar15;
              puVar9 = (uint *)((long)puVar15 + 1);
              puVar14 = (uint *)((ulong)puVar14 |
                                (ulong)((byte)uVar16 & 0x7f) << ((byte)lVar8 & 0x3f));
              lVar8 = lVar8 + 7;
              puVar15 = puVar9;
              psVar20 = (string *)puVar14;
            } while ((char)(byte)uVar16 < '\0');
          }
        }
        puVar10 = (uint *)0x0;
        local_58 = psVar20;
        if (bVar12) {
          puVar9 = puVar11;
          local_58 = (string *)puVar10;
        }
        if (puVar9 == puVar11) {
          puVar14 = (uint *)0x0;
          bVar12 = false;
          puVar15 = (uint *)0x0;
        }
        else if ((uint *)((long)puVar18 - (long)puVar9) < local_58) {
          puVar10 = (uint *)0x0;
          puVar14 = (uint *)0x0;
          bVar12 = false;
          puVar15 = (uint *)0x0;
        }
        else {
          puVar10 = (uint *)((ulong)puVar9 >> 0x20);
          puVar14 = (uint *)((ulong)puVar9 & 0xffffffff);
          puVar9 = (uint *)((long)puVar9 + (long)local_58);
          bVar12 = true;
          puVar15 = (uint *)local_58;
        }
        local_80 = puVar11;
        if (!bVar12) goto LAB_00229fc8;
        goto LAB_00229ffa;
      default:
        goto switchD_00229e38_caseD_3;
      case 5:
        puVar9 = puVar11 + 1;
        puVar10 = (uint *)0x0;
        if (puVar18 < puVar9) goto LAB_00229fc8;
        puVar14 = (uint *)(ulong)*puVar11;
      }
      puVar15 = (uint *)0x0;
LAB_00229ffa:
      bVar12 = true;
      raw = puVar9;
      if ((uVar5 < 0x10000) && (puVar15 < (uint *)0x10000000)) {
        local_70.int_value_ = (ulong)puVar14 & 0xffffffff | (long)puVar10 << 0x20;
        uVar13 = (ulong)puVar15 | (uVar13 >> 3) << 0x20 | (ulong)((uint)uVar13 & 7) << 0x30;
        bVar12 = false;
      }
      else {
        local_70.int_value_ = 0;
        uVar13 = 0;
      }
    }
LAB_0022a03c:
    puVar11 = &switchD_00229e38::switchdataD_0034cfc4;
    if (!bVar12) {
      local_70.size_ = (uint32_t)uVar13;
      local_70.type_ = (uint8_t)(uVar13 >> 0x30);
      local_70.id_ = (uint16_t)(uVar13 >> 0x20);
      if (local_70.id_ != 0) {
        local_58 = &this->name_;
        local_60 = this_00;
        do {
          uVar7 = (ushort)(uVar13 >> 0x20);
          if (uVar7 < 6) {
            (this->_has_field_).super__Base_bitset<1UL>._M_w =
                 (this->_has_field_).super__Base_bitset<1UL>._M_w |
                 1L << ((byte)(uVar13 >> 0x20) & 0x3f);
          }
          if (uVar7 == 5) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::emplace_back<>(local_38);
            protozero::Field::get
                      (&local_70,
                       (this->reserved_name_).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1);
          }
          else {
            uVar5 = (uint)(uVar13 >> 0x20) & 0xffff;
            if (uVar5 == 2) {
              std::
              vector<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
              ::emplace_back<>(this_00);
              pEVar2 = (this->value_).
                       super__Vector_base<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              (*pEVar2[-1].super_CppMessageObj._vptr_CppMessageObj[4])
                        (pEVar2 + -1,local_70.int_value_,(ulong)local_70.size_);
            }
            else if (uVar5 == 1) {
              protozero::Field::get(&local_70,local_58);
            }
            else {
              protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
                        (&local_70,local_40);
            }
          }
          do {
            if (puVar18 <= raw) goto LAB_0022a23d;
            uVar13 = (ulong)(char)(byte)*raw;
            puVar9 = (uint *)((long)raw + 1);
            if ((long)uVar13 < 0) {
              uVar6 = (ulong)((byte)*raw & 0x7f);
              bVar12 = false;
              uVar13 = uVar6;
              puVar10 = puVar9;
              if ((char)(byte)*raw < '\0') {
                lVar8 = 7;
                puVar14 = puVar9;
                do {
                  bVar12 = 0x38 < lVar8 - 7U || puVar18 <= puVar14;
                  uVar13 = 0;
                  puVar10 = puVar9;
                  if (bVar12) break;
                  uVar5 = *puVar14;
                  puVar14 = (uint *)((long)puVar14 + 1);
                  uVar6 = uVar6 | (ulong)((byte)uVar5 & 0x7f) << ((byte)lVar8 & 0x3f);
                  lVar8 = lVar8 + 7;
                  uVar13 = uVar6;
                  puVar10 = puVar14;
                } while ((char)(byte)uVar5 < '\0');
              }
              puVar9 = puVar10;
              if (bVar12) {
                puVar9 = (uint *)raw;
                uVar13 = 0;
              }
              if (puVar9 == (uint *)raw) goto LAB_0022a23d;
            }
            uVar5 = (uint)(uVar13 >> 3);
            if ((uVar5 == 0) || (puVar18 <= puVar9)) {
switchD_0022a2cf_caseD_3:
              local_70.int_value_ = 0;
              bVar12 = false;
              uVar13 = 0;
              goto LAB_0022a511;
            }
            switch((uint)uVar13 & 7) {
            case 0:
              local_70.int_value_ = 0;
              bVar12 = puVar9 >= puVar18;
              if (puVar9 < puVar18) {
                puVar10 = (uint *)((long)puVar9 + 1);
                uVar16 = (byte)*puVar9 & 0x7f;
                uVar6 = (ulong)uVar16;
                puVar14 = (uint *)(ulong)uVar16;
                puVar11 = puVar10;
                uVar16 = 0;
                if ((char)(byte)*puVar9 < '\0') {
                  puVar14 = (uint *)0x0;
                  lVar8 = 7;
                  puVar15 = puVar10;
                  do {
                    bVar21 = 0x38 < lVar8 - 7U;
                    bVar12 = bVar21 || puVar18 <= puVar15;
                    puVar11 = puVar10;
                    uVar16 = 0;
                    if (bVar21 || puVar18 <= puVar15) break;
                    bVar1 = (byte)*puVar15;
                    puVar15 = (uint *)((long)puVar15 + 1);
                    uVar6 = uVar6 | (ulong)(bVar1 & 0x7f) << ((byte)lVar8 & 0x3f);
                    lVar8 = lVar8 + 7;
                    if (-1 < (char)bVar1) {
                      puVar14 = (uint *)(uVar6 & 0xffffffff);
                    }
                    puVar11 = puVar15;
                    uVar16 = (uint)(uVar6 >> 0x20);
                  } while (-1 >= (char)bVar1);
                }
              }
              else {
                puVar14 = (uint *)0x0;
                uVar16 = 0;
              }
              if (bVar12) {
                puVar14 = (uint *)local_70.int_value_;
              }
              puVar10 = (uint *)(ulong)uVar16;
              if (bVar12) {
                puVar11 = puVar9;
                puVar10 = (uint *)local_70.int_value_;
              }
              puVar15 = (uint *)local_70.int_value_;
              this_00 = local_60;
              local_50 = (uint *)raw;
              local_48 = puVar9;
              if (puVar11 == puVar9) {
                uVar13 = 0;
                bVar12 = false;
              }
              else {
LAB_0022a4c6:
                bVar12 = true;
                raw = puVar11;
                if ((uVar5 < 0x10000) && (puVar15 < (uint *)0x10000000)) {
                  local_70.int_value_ = (ulong)puVar14 & 0xffffffff | (long)puVar10 << 0x20;
                  uVar13 = (ulong)puVar15 | (uVar13 >> 3) << 0x20 | (uVar13 & 7) << 0x30;
                  bVar12 = false;
                }
                else {
                  local_70.int_value_ = 0;
                  uVar13 = 0;
                }
              }
              break;
            case 1:
              puVar11 = puVar9 + 2;
              if (puVar11 <= puVar18) {
                puVar14 = *(uint **)puVar9;
                puVar10 = (uint *)((ulong)puVar14 >> 0x20);
LAB_0022a33a:
                puVar15 = (uint *)0x0;
                goto LAB_0022a4c6;
              }
              goto LAB_0022a23d;
            case 2:
              bVar12 = puVar9 >= puVar18;
              puVar10 = local_80;
              if (puVar9 < puVar18) {
                puVar14 = (uint *)((long)puVar9 + 1);
                puVar15 = (uint *)(ulong)((byte)*puVar9 & 0x7f);
                puVar11 = puVar14;
                puVar10 = puVar15;
                if ((char)(byte)*puVar9 < '\0') {
                  lVar8 = 7;
                  puVar17 = puVar14;
                  do {
                    bVar12 = 0x38 < lVar8 - 7U || puVar18 <= puVar17;
                    puVar11 = puVar14;
                    puVar10 = local_80;
                    if (bVar12) break;
                    uVar16 = *puVar17;
                    puVar11 = (uint *)((long)puVar17 + 1);
                    puVar15 = (uint *)((ulong)puVar15 |
                                      (ulong)((byte)uVar16 & 0x7f) << ((byte)lVar8 & 0x3f));
                    lVar8 = lVar8 + 7;
                    puVar17 = puVar11;
                    puVar10 = puVar15;
                  } while ((char)(byte)uVar16 < '\0');
                }
              }
              local_80 = puVar10;
              puVar14 = (uint *)0x0;
              if (bVar12) {
                puVar11 = puVar9;
                local_80 = puVar14;
              }
              if (puVar11 == puVar9) {
                puVar10 = (uint *)0x0;
                bVar12 = false;
                puVar15 = (uint *)0x0;
              }
              else if ((uint *)((long)puVar18 - (long)puVar11) < local_80) {
                puVar14 = (uint *)0x0;
                puVar10 = (uint *)0x0;
                bVar12 = false;
                puVar15 = (uint *)0x0;
              }
              else {
                puVar10 = (uint *)((ulong)puVar11 >> 0x20);
                puVar14 = (uint *)((ulong)puVar11 & 0xffffffff);
                puVar11 = (uint *)((long)puVar11 + (long)local_80);
                bVar12 = true;
                puVar15 = local_80;
              }
              if (bVar12) goto LAB_0022a4c6;
              local_70.int_value_ = 0;
              uVar13 = 0;
              bVar12 = false;
              break;
            default:
              goto switchD_0022a2cf_caseD_3;
            case 5:
              puVar11 = puVar9 + 1;
              puVar10 = (uint *)0x0;
              if (puVar11 <= puVar18) {
                puVar14 = (uint *)(ulong)*puVar9;
                goto LAB_0022a33a;
              }
LAB_0022a23d:
              local_70.int_value_ = 0;
              uVar13 = 0;
              bVar12 = false;
            }
LAB_0022a511:
          } while (bVar12);
          local_70.size_ = (uint32_t)uVar13;
          local_70.type_ = (uint8_t)(uVar13 >> 0x30);
          local_70.id_ = (uint16_t)(uVar13 >> 0x20);
        } while (local_70.id_ != 0);
      }
      return puVar18 == (uint *)raw;
    }
  } while( true );
}

Assistant:

bool EnumDescriptorProto::ParseFromArray(const void* raw, size_t size) {
  value_.clear();
  reserved_name_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* name */:
        field.get(&name_);
        break;
      case 2 /* value */:
        value_.emplace_back();
        value_.back().ParseFromArray(field.data(), field.size());
        break;
      case 5 /* reserved_name */:
        reserved_name_.emplace_back();
        field.get(&reserved_name_.back());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}